

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O2

void __thiscall write_slot::operator()(write_slot *this,wm_slot_le *slot,xr_writer *w)

{
  undefined4 local_1c;
  
  local_1c = (undefined4)
             (((long)(slot->wallmarks).
                     super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(slot->wallmarks).
                    super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x50);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xray_re::xr_writer::w_sz(w,&slot->shader);
  xray_re::xr_writer::w_sz(w,&slot->texture);
  xray_re::xr_writer::
  w_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,write_wallmark>
            (w,&slot->wallmarks);
  return;
}

Assistant:

void operator()(const wm_slot_le* slot, xr_writer& w) const {
	w.w_size_u32(slot->wallmarks.size());
	w.w_sz(slot->shader);
	w.w_sz(slot->texture);
	w.w_seq(slot->wallmarks, write_wallmark());
}